

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::PlayBard(Character *this,uchar instrument,uchar note,bool echo)

{
  Character *other;
  bool bVar1;
  _List_node_base *p_Var2;
  list<Character_*,_std::allocator<Character_*>_> *plVar3;
  PacketBuilder builder;
  
  PacketBuilder::PacketBuilder(&builder,PACKET_JUKEBOX,PACKET_MSG,5);
  PacketBuilder::AddShort(&builder,(unsigned_short)this->player->id);
  PacketBuilder::AddChar(&builder,this->direction);
  PacketBuilder::AddChar(&builder,instrument);
  PacketBuilder::AddChar(&builder,note);
  plVar3 = &this->map->characters;
  p_Var2 = (_List_node_base *)plVar3;
LAB_001708ec:
  p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)plVar3) {
    PacketBuilder::~PacketBuilder(&builder);
    return;
  }
  other = (Character *)p_Var2[1]._M_next;
  if (!echo) goto code_r0x001708fd;
  goto LAB_00170911;
code_r0x001708fd:
  if (other != this) {
    bVar1 = InRange(this,other);
    if (bVar1) {
LAB_00170911:
      Send(other,&builder);
    }
  }
  goto LAB_001708ec;
}

Assistant:

void Character::PlayBard(unsigned char instrument, unsigned char note, bool echo)
{
	PacketBuilder builder(PACKET_JUKEBOX, PACKET_MSG, 5);

	builder.AddShort(this->PlayerID());
	builder.AddChar(this->direction);
	builder.AddChar(instrument);
	builder.AddChar(note);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (!echo && (character == this || !this->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}